

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpkAbcDsd.c
# Opt level: O3

int Lpk_FunComputeMinSuppSizeVar
              (Lpk_Fun_t *p,uint **ppTruths,int nTruths,uint **ppCofs,uint uNonDecSupp)

{
  uint iVar;
  long lVar1;
  long lVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  uint local_74;
  int local_70;
  int local_6c;
  
  if (0 < nTruths) {
    local_6c = -1;
    lVar1 = 0;
    local_70 = -1;
    local_74 = 0xffffffff;
    do {
      iVar = (uint)lVar1;
      if (((uNonDecSupp >> (iVar & 0x1f) & 1) != 0) && ((1 << ((byte)lVar1 & 0x1f) & p->uSupp) != 0)
         ) {
        lVar2 = 0;
        iVar3 = 0;
        iVar4 = 0;
        do {
          if (nTruths == 1) {
            uVar5 = p->puSupps[lVar1 * 2];
            uVar7 = (p->puSupps + lVar1 * 2)[1];
            uVar5 = (uVar5 >> 1 & 0x55555555) + (uVar5 & 0x55555555);
            uVar7 = (uVar7 >> 1 & 0x55555555) + (uVar7 & 0x55555555);
            uVar5 = (uVar5 >> 2 & 0x33333333) + (uVar5 & 0x33333333);
            uVar7 = (uVar7 >> 2 & 0x33333333) + (uVar7 & 0x33333333);
            uVar5 = (uVar5 >> 4 & 0x7070707) + (uVar5 & 0x7070707);
            uVar7 = (uVar7 >> 4 & 0x7070707) + (uVar7 & 0x7070707);
            uVar5 = (uVar5 >> 8 & 0xf000f) + (uVar5 & 0xf000f);
            uVar7 = (uVar7 >> 8 & 0xf000f) + (uVar7 & 0xf000f);
            iVar6 = (uVar5 >> 0x10) + (uVar5 & 0x1f);
            iVar8 = (uVar7 >> 0x10) + (uVar7 & 0x1f);
          }
          else {
            Kit_TruthCofactor0New
                      (*(uint **)((long)ppCofs + lVar2 * 2),*(uint **)((long)ppTruths + lVar2),
                       *(uint *)&p->field_0x8 >> 7 & 0x1f,iVar);
            Kit_TruthCofactor1New
                      (*(uint **)((long)ppCofs + lVar2 * 2 + 8),*(uint **)((long)ppTruths + lVar2),
                       *(uint *)&p->field_0x8 >> 7 & 0x1f,iVar);
            iVar6 = Kit_TruthSupportSize
                              (*(uint **)((long)ppCofs + lVar2 * 2),
                               *(uint *)&p->field_0x8 >> 7 & 0x1f);
            iVar8 = Kit_TruthSupportSize
                              (*(uint **)((long)ppCofs + lVar2 * 2 + 8),
                               *(uint *)&p->field_0x8 >> 7 & 0x1f);
          }
          if (iVar3 <= iVar6) {
            iVar3 = iVar6;
          }
          if (iVar3 <= iVar8) {
            iVar3 = iVar8;
          }
          iVar4 = iVar4 + iVar6 + iVar8;
          lVar2 = lVar2 + 8;
        } while ((ulong)(uint)nTruths * 8 != lVar2);
        if (((local_74 == 0xffffffff) || (iVar3 < local_6c)) ||
           ((local_6c == iVar3 && (iVar4 < local_70)))) {
          local_74 = iVar;
          local_70 = iVar4;
          local_6c = iVar3;
        }
      }
      lVar1 = lVar1 + 1;
    } while (lVar1 != 0x10);
    lVar1 = 0;
    do {
      Kit_TruthCofactor0New
                (*(uint **)((long)ppCofs + lVar1 * 2),*(uint **)((long)ppTruths + lVar1),
                 *(uint *)&p->field_0x8 >> 7 & 0x1f,local_74);
      Kit_TruthCofactor1New
                (*(uint **)((long)ppCofs + lVar1 * 2 + 8),*(uint **)((long)ppTruths + lVar1),
                 *(uint *)&p->field_0x8 >> 7 & 0x1f,local_74);
      lVar1 = lVar1 + 8;
    } while ((ulong)(uint)nTruths * 8 != lVar1);
    return local_74;
  }
  __assert_fail("nTruths > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/lpk/lpkAbcDsd.c"
                ,0x36,
                "int Lpk_FunComputeMinSuppSizeVar(Lpk_Fun_t *, unsigned int **, int, unsigned int **, unsigned int)"
               );
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Cofactors TTs w.r.t. all vars and finds the best var.]

  Description [The best variable is the variable with the minimum 
  sum total of the support sizes of all truth tables. This procedure 
  computes and returns cofactors w.r.t. the best variable.]
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
int Lpk_FunComputeMinSuppSizeVar( Lpk_Fun_t * p, unsigned ** ppTruths, int nTruths, unsigned ** ppCofs, unsigned uNonDecSupp )
{
    int i, Var, VarBest, nSuppSize0, nSuppSize1;
    int nSuppTotalMin = -1; // Suppress "might be used uninitialized"
    int nSuppTotalCur;
    int nSuppMaxMin = -1; // Suppress "might be used uninitialized"
    int nSuppMaxCur;
    assert( nTruths > 0 );
    VarBest = -1;
    Lpk_SuppForEachVar( p->uSupp, Var )
    {
        if ( (uNonDecSupp & (1 << Var)) == 0 )
            continue;
        nSuppMaxCur = 0;
        nSuppTotalCur = 0;
        for ( i = 0; i < nTruths; i++ )
        {
            if ( nTruths == 1 )
            {
                nSuppSize0 = Kit_WordCountOnes( p->puSupps[2*Var+0] );
                nSuppSize1 = Kit_WordCountOnes( p->puSupps[2*Var+1] );
            }
            else
            {
                Kit_TruthCofactor0New( ppCofs[2*i+0], ppTruths[i], p->nVars, Var );
                Kit_TruthCofactor1New( ppCofs[2*i+1], ppTruths[i], p->nVars, Var );
                nSuppSize0 = Kit_TruthSupportSize( ppCofs[2*i+0], p->nVars );
                nSuppSize1 = Kit_TruthSupportSize( ppCofs[2*i+1], p->nVars );
            }        
            nSuppMaxCur = Abc_MaxInt( nSuppMaxCur, nSuppSize0 );
            nSuppMaxCur = Abc_MaxInt( nSuppMaxCur, nSuppSize1 );
            nSuppTotalCur += nSuppSize0 + nSuppSize1;
        }
        if ( VarBest == -1 || nSuppMaxMin > nSuppMaxCur ||
             (nSuppMaxMin == nSuppMaxCur && nSuppTotalMin > nSuppTotalCur) )
        {
            VarBest = Var;
            nSuppMaxMin = nSuppMaxCur;
            nSuppTotalMin = nSuppTotalCur;
        }
    }
    // recompute cofactors for the best var
    for ( i = 0; i < nTruths; i++ )
    {
        Kit_TruthCofactor0New( ppCofs[2*i+0], ppTruths[i], p->nVars, VarBest );
        Kit_TruthCofactor1New( ppCofs[2*i+1], ppTruths[i], p->nVars, VarBest );
    }
    return VarBest;
}